

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_long,(unsigned_short)512>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [12];
  byte *p;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar4;
  uint res;
  ParseContext *ctx_00;
  RepeatedField<unsigned_long> *this;
  char *pcVar5;
  uint *puVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  
  puVar6 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar6 & 3) != 0) {
    AlignFail();
  }
  this = (RepeatedField<unsigned_long> *)((long)&msg->_vptr_MessageLite + (ulong)*puVar6);
  if (((ulong)this & 7) != 0) {
    AlignFail(this);
  }
  do {
    pcVar5 = (char *)(long)*ptr;
    if ((long)pcVar5 < 0) {
      aVar4.data = (long)ptr[1] << 7 | 0x7f;
      if ((long)aVar4 < 0) {
        ctx_00 = (ParseContext *)((long)ptr[2] << 0xe | 0x3fff);
        if ((long)ctx_00 < 0) {
          aVar4.data = aVar4.data & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)aVar4 < 0) {
            ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[4] << 0x1c | 0xfffffffU));
            if ((long)ctx_00 < 0) {
              aVar4.data = aVar4.data & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)aVar4 < 0) {
                ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU));
                if ((long)ctx_00 < 0) {
                  aVar4.data = aVar4.data & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)aVar4 < 0) {
                    ctx_00 = (ParseContext *)
                             ((ulong)ctx_00 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff));
                    if ((long)ctx_00 < 0) {
                      bVar1 = ptr[9];
                      p = (byte *)(ptr + 10);
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') goto LAB_002c79d5;
                        if ((bVar1 & 1) == 0) {
                          ctx_00 = (ParseContext *)((ulong)ctx_00 ^ 0x8000000000000000);
                        }
                      }
                    }
                    else {
                      p = (byte *)(ptr + 9);
                    }
                  }
                  else {
                    p = (byte *)(ptr + 8);
                  }
                }
                else {
                  p = (byte *)(ptr + 7);
                }
              }
              else {
                p = (byte *)(ptr + 6);
              }
            }
            else {
              p = (byte *)(ptr + 5);
            }
          }
          else {
            p = (byte *)(ptr + 4);
          }
        }
        else {
          p = (byte *)(ptr + 3);
        }
        aVar4.data = aVar4.data & (ulong)ctx_00;
      }
      else {
        p = (byte *)(ptr + 2);
      }
      pcVar5 = (char *)((ulong)pcVar5 & aVar4.data);
    }
    else {
      p = (byte *)(ptr + 1);
    }
    RepeatedField<unsigned_long>::Add(this,-(ulong)((uint)pcVar5 & 1) ^ (ulong)pcVar5 >> 1);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) break;
    bVar1 = *p;
    auVar3[8] = bVar1;
    auVar3._0_8_ = p + 1;
    auVar3._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = p[1];
      aVar4.data = (ulong)bVar2 << 7;
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pcVar5 = (char *)(ulong)res;
        pVar7 = ReadTagFallback((char *)p,res);
        auVar3 = pVar7._0_12_;
        ctx_00 = pVar7._8_8_;
        if (pVar7.first == (char *)0x0) {
LAB_002c79d5:
          pcVar5 = Error(msg,pcVar5,ctx_00,(TcFieldData)aVar4,table,hasbits);
          return pcVar5;
        }
      }
      else {
        auVar3._8_4_ = res;
        auVar3._0_8_ = p + 2;
      }
    }
    ptr = auVar3._0_8_;
  } while (auVar3._8_4_ == data.field_0._0_4_);
  if ((ulong)table->has_bits_offset != 0) {
    puVar6 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar6 & 3) != 0) {
      AlignFail(puVar6);
    }
    *puVar6 = *puVar6 | (uint)hasbits;
  }
  return (char *)p;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (ABSL_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}